

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_hydroperception(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6d9a06);
    uVar3 = 0;
    get_spell_aftype(in_stack_ffffffffffffff78);
    uVar2 = (undefined2)in_EDI;
    affect_to_char(in_stack_ffffffffffffff80,(AFFECT_DATA *)in_stack_ffffffffffffff78);
    send_to_char((char *)CONCAT26(in_SI,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void spell_hydroperception(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("Your eyes are already accommodated to seeing in water.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.mod_name = MOD_PERCEPTION;
	affect_to_char(ch, &af);

	send_to_char("You focus your senses on changes in the water around you.\n\r", ch);
}